

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thrift_tools.hpp
# Opt level: O2

ReadHead * __thiscall duckdb::ReadAheadBuffer::GetReadHead(ReadAheadBuffer *this,idx_t pos)

{
  ulong uVar1;
  ReadAheadBuffer *pRVar2;
  
  pRVar2 = this;
  do {
    pRVar2 = (ReadAheadBuffer *)
             (pRVar2->read_heads).
             super__List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>._M_impl._M_node.
             super__List_node_base._M_next;
    if (pRVar2 == this) {
      return (ReadHead *)0x0;
    }
    uVar1 = (pRVar2->read_heads).
            super__List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>._M_impl._M_node.
            _M_size;
  } while ((pos < uVar1) || (uVar1 + *(long *)&(pRVar2->merge_set)._M_t._M_impl <= pos));
  return (ReadHead *)
         &(pRVar2->read_heads).super__List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>
          ._M_impl._M_node._M_size;
}

Assistant:

ReadHead *GetReadHead(idx_t pos) {
		for (auto &read_head : read_heads) {
			if (pos >= read_head.location && pos < read_head.GetEnd()) {
				return &read_head;
			}
		}
		return nullptr;
	}